

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

uint jx9_array_count(jx9_value *pArray)

{
  jx9_hashmap *pMap;
  jx9_value *pArray_local;
  
  if ((pArray->iFlags & 0x40U) == 0) {
    pArray_local._4_4_ = 0;
  }
  else {
    pArray_local._4_4_ = *(uint *)((pArray->x).iVal + 0x2c);
  }
  return pArray_local._4_4_;
}

Assistant:

JX9_PRIVATE unsigned int jx9_array_count(jx9_value *pArray)
{
	jx9_hashmap *pMap;
	/* Make sure we are dealing with a valid hashmap */
	if( (pArray->iFlags & MEMOBJ_HASHMAP) == 0 ){
		return 0;
	}
	/* Point to the internal representation of the hashmap */
	pMap = (jx9_hashmap *)pArray->x.pOther;
	return pMap->nEntry;
}